

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  Type *addr;
  uint uVar1;
  int iVar2;
  uint newSize;
  Type TVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint bucketCount;
  Type local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (uVar8 = uVar1 & 0x7fffffff, bucketCount = uVar8, (uVar1 - 1 & uVar8) != 0))
  {
    iVar2 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    bucketCount = 2;
    if (uVar8 != 1) {
      bucketCount = 1 << (-((byte)iVar2 ^ 0x1f) & 0x1f);
    }
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  addr = &this->entries;
  if (bucketCount == this->bucketCount) {
    newBuckets = (int *)AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,Memory::WriteBarrierPtr<Js::DynamicProfileInfo>>,Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,Memory::Recycler>
              ((SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    piVar4 = newBuckets;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->entries).ptr =
         (SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_> *)
         piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,Memory::WriteBarrierPtr<Js::DynamicProfileInfo>>,Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,Memory::Recycler>
              ((SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        if (-2 < *(int *)((long)newBuckets + lVar6 + 8)) {
          uVar5 = GetBucket(*(int *)((long)newBuckets + lVar6 + 0xc) * 2 + 1,bucketCount,
                            this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar6 + 8) = local_40.ptr[(int)uVar5];
          local_40.ptr[(int)uVar5] = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar7 < this->count);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar3.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar4 = newBuckets;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->entries).ptr =
         (SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_> *)
         piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }